

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::doSplitPages(QPDFJob *this,QPDF *pdf)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  size_t sVar8;
  size_type __val;
  unsigned_long uVar9;
  unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> uVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  QPDFAcroFormDocumentHelper *from_afdh;
  const_reference pvVar11;
  element_type *peVar12;
  element_type *this_02;
  longlong start_idx;
  longlong end_idx;
  char *pcVar13;
  runtime_error *this_03;
  void *__buf;
  QPDFWriter *w_00;
  anon_class_8_1_416780aa local_4b8;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_4b0;
  undefined1 local_490 [8];
  QPDFWriter w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  undefined1 local_438 [8];
  string outfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  undefined1 local_3d8 [8];
  string page_range;
  string local_3b0;
  QPDFObjectHandle local_390;
  QPDFObjectHandle local_380;
  allocator<char> local_369;
  string local_368;
  undefined1 local_348 [8];
  QPDFObjectHandle page_labels;
  size_t local_330;
  undefined1 local_328 [8];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> labels;
  exception *e;
  QPDFObjectHandle local_268;
  QPDFObjectHandle local_258;
  undefined1 local_248 [8];
  QPDFObjectHandle new_page;
  undefined1 local_228 [8];
  QPDFObjectHandle page;
  size_t pageno;
  undefined1 local_200 [8];
  shared_ptr<QPDFAcroFormDocumentHelper> out_afdh;
  QPDF outpdf;
  size_t last;
  size_t first;
  size_t i;
  size_t num_pages;
  unsigned_long local_1a8;
  size_t pageno_len;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pages;
  QPDFAcroFormDocumentHelper afdh;
  QPDFPageLabelDocumentHelper pldh;
  QPDFPageDocumentHelper dh;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  allocator local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  allocator local_a1;
  long local_a0;
  string local_98 [48];
  char *local_68;
  char *num_spot;
  size_t len;
  string after;
  string before;
  QPDF *pdf_local;
  QPDFJob *this_local;
  
  std::__cxx11::string::string((string *)(after.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&len);
  peVar5 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar6 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(peVar5->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
  num_spot = (char *)strlen(peVar6);
  peVar5 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar6 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(peVar5->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
  local_68 = strstr(peVar6,"%d");
  if (local_68 == (char *)0x0) {
    if ((char *)0x3 < num_spot) {
      peVar5 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar6 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(peVar5->outfilename).
                           super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
      iVar3 = QUtil::str_compare_nocase(peVar6 + -4 + (long)num_spot,".pdf");
      if (iVar3 == 0) {
        QTC::TC("qpdf","QPDFJob split-pages .pdf",0);
        peVar5 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        peVar6 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                           (&(peVar5->outfilename).
                             super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
        pcVar13 = num_spot + -4;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e8,peVar6,(ulong)pcVar13,&local_e9);
        std::operator+(&local_c8,&local_e8,"-");
        std::__cxx11::string::operator=
                  ((string *)(after.field_2._M_local_buf + 8),(string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_e9);
        peVar5 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        peVar6 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                           (&(peVar5->outfilename).
                             super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
        std::__cxx11::string::operator=((string *)&len,peVar6 + -4 + (long)num_spot);
        goto LAB_001ed358;
      }
    }
    QTC::TC("qpdf","QPDFJob split-pages other",0);
    peVar5 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar6 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(peVar5->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,peVar6,
               (allocator<char> *)
               ((long)&dh.m.
                       super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    std::operator+(&local_110,&local_130,"-");
    std::__cxx11::string::operator=((string *)(after.field_2._M_local_buf + 8),(string *)&local_110)
    ;
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&dh.m.
                       super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
  }
  else {
    QTC::TC("qpdf","QPDFJob split-pages %d",0);
    peVar5 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar6 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(peVar5->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>)
    ;
    pcVar13 = local_68;
    peVar5 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar7 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(peVar5->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>)
    ;
    local_a0 = (long)pcVar13 - (long)peVar7;
    sVar8 = QIntC::to_size<long>(&local_a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,peVar6,sVar8,&local_a1);
    std::__cxx11::string::operator=((string *)(after.field_2._M_local_buf + 8),local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::__cxx11::string::operator=((string *)&len,local_68 + 2);
  }
LAB_001ed358:
  bVar2 = shouldRemoveUnreferencedResources(this,pdf);
  if (bVar2) {
    QPDFPageDocumentHelper::QPDFPageDocumentHelper
              ((QPDFPageDocumentHelper *)
               &pldh.m.
                super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,pdf);
    QPDFPageDocumentHelper::removeUnreferencedResources
              ((QPDFPageDocumentHelper *)
               &pldh.m.
                super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper
              ((QPDFPageDocumentHelper *)
               &pldh.m.
                super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper
            ((QPDFPageLabelDocumentHelper *)
             &afdh.m.
              super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pdf);
  QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper((QPDFAcroFormDocumentHelper *)&pages,pdf);
  pageno_len = (size_t)QPDF::getAllPages(pdf);
  __val = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)pageno_len);
  std::__cxx11::to_string((string *)&num_pages,__val);
  uVar9 = std::__cxx11::string::length();
  std::__cxx11::string::~string((string *)&num_pages);
  local_1a8 = uVar9;
  uVar10._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
       (__uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true>)
       std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                 ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)pageno_len);
  first = 0;
  while( true ) {
    if ((ulong)uVar10._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
               ._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl <= first) {
      QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper((QPDFAcroFormDocumentHelper *)&pages);
      QPDFPageLabelDocumentHelper::~QPDFPageLabelDocumentHelper
                ((QPDFPageLabelDocumentHelper *)
                 &afdh.m.
                  super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__cxx11::string::~string((string *)&len);
      std::__cxx11::string::~string((string *)(after.field_2._M_local_buf + 8));
      return;
    }
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(first + 1);
    peVar5 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    from_afdh = (QPDFAcroFormDocumentHelper *)QIntC::to_size<int>(&peVar5->split_pages);
    outpdf.m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
         (unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>)
         ((long)&(from_afdh->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper + first);
    if ((ulong)uVar10._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
               ._M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl <
        (ulong)outpdf.m._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl) {
      outpdf.m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
      super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
           (unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>)
           (unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>)
           uVar10._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    }
    QPDF::QPDF((QPDF *)&out_afdh.
                        super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    QPDF::emptyPDF((QPDF *)&out_afdh.
                            super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
    std::shared_ptr<QPDFAcroFormDocumentHelper>::shared_ptr
              ((shared_ptr<QPDFAcroFormDocumentHelper> *)local_200);
    bVar2 = QPDFAcroFormDocumentHelper::hasAcroForm((QPDFAcroFormDocumentHelper *)&pages);
    if (bVar2) {
      std::make_shared<QPDFAcroFormDocumentHelper,QPDF&>((QPDF *)&pageno);
      std::shared_ptr<QPDFAcroFormDocumentHelper>::operator=
                ((shared_ptr<QPDFAcroFormDocumentHelper> *)local_200,
                 (shared_ptr<QPDFAcroFormDocumentHelper> *)&pageno);
      std::shared_ptr<QPDFAcroFormDocumentHelper>::~shared_ptr
                ((shared_ptr<QPDFAcroFormDocumentHelper> *)&pageno);
    }
    peVar5 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    _Var1._M_pi = this_01;
    if ((peVar5->suppress_warnings & 1U) != 0) {
      QPDF::setSuppressWarnings
                ((QPDF *)&out_afdh.
                          super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount,true);
    }
    while (page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi = _Var1._M_pi,
          page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi <=
          (ulong)outpdf.m._M_t.
                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                 super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl) {
      pvVar11 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                          ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)pageno_len
                           ,(size_type)
                            ((long)&page.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi[-1]._M_weak_count + 3));
      QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_228,pvVar11);
      this_00 = &new_page.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this_00,(QPDFObjectHandle *)local_228);
      QPDF::addPage((QPDF *)&out_afdh.
                             super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount,(QPDFObjectHandle *)this_00,false);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &new_page.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFObjectHandle::QPDFObjectHandle(&local_258,(QPDFObjectHandle *)local_228);
      added_page((QPDF *)local_248,
                 (QPDFObjectHandle *)
                 &out_afdh.
                  super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      QPDFObjectHandle::~QPDFObjectHandle(&local_258);
      peVar12 = std::__shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2> *)
                           local_200);
      if (peVar12 != (element_type *)0x0) {
        QTC::TC("qpdf","QPDFJob copy form fields in split_pages",0);
        this_02 = std::
                  __shared_ptr_access<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_200);
        QPDFObjectHandle::QPDFObjectHandle(&local_268,(QPDFObjectHandle *)local_248);
        QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&e,(QPDFObjectHandle *)local_228);
        from_afdh = (QPDFAcroFormDocumentHelper *)&pages;
        QPDFAcroFormDocumentHelper::fixCopiedAnnotations
                  (this_02,&local_268,(QPDFObjectHandle *)&e,from_afdh,
                   (set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)0x0);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&e);
        QPDFObjectHandle::~QPDFObjectHandle(&local_268);
      }
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_248);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_228);
      _Var1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&(page.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + 1);
    }
    bVar2 = QPDFPageLabelDocumentHelper::hasPageLabels
                      ((QPDFPageLabelDocumentHelper *)
                       &afdh.m.
                        super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
    if (bVar2) {
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_328);
      local_330 = first;
      start_idx = QIntC::to_longlong<unsigned_long>(&local_330);
      page_labels.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)outpdf.m._M_t.
                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl + -1);
      end_idx = QIntC::to_longlong<unsigned_long>
                          ((unsigned_long *)
                           &page_labels.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      from_afdh = (QPDFAcroFormDocumentHelper *)0x0;
      QPDFPageLabelDocumentHelper::getLabelsForPageRange
                ((QPDFPageLabelDocumentHelper *)
                 &afdh.m.
                  super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,start_idx,end_idx,0,
                 (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_328);
      QPDFObjectHandle::newDictionary();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"/Nums",&local_369);
      QPDFObjectHandle::newArray
                (&local_380,(vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_328
                );
      QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_348,&local_368,&local_380);
      QPDFObjectHandle::~QPDFObjectHandle(&local_380);
      std::__cxx11::string::~string((string *)&local_368);
      std::allocator<char>::~allocator(&local_369);
      QPDF::getRoot((QPDF *)&local_390);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b0,"/PageLabels",
                 (allocator<char> *)(page_range.field_2._M_local_buf + 0xf));
      QPDFObjectHandle::replaceKey(&local_390,&local_3b0,(QPDFObjectHandle *)local_348);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::allocator<char>::~allocator((allocator<char> *)(page_range.field_2._M_local_buf + 0xf));
      QPDFObjectHandle::~QPDFObjectHandle(&local_390);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_348);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_328);
    }
    uVar4 = QIntC::to_int<unsigned_long>(&local_1a8);
    QUtil::uint_to_string_abi_cxx11_
              ((string *)local_3d8,(QUtil *)this_01,(ulong)uVar4,(int)from_afdh);
    peVar5 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    if (1 < peVar5->split_pages) {
      uVar4 = QIntC::to_int<unsigned_long>(&local_1a8);
      QUtil::uint_to_string_abi_cxx11_
                ((string *)((long)&outfile.field_2 + 8),
                 (QUtil *)outpdf.m._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl,(ulong)uVar4,
                 (int)from_afdh);
      std::operator+(&local_3f8,"-",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&outfile.field_2 + 8));
      std::__cxx11::string::operator+=((string *)local_3d8,(string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)(outfile.field_2._M_local_buf + 8));
    }
    std::operator+(&local_458,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&after.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                   &local_458,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len);
    std::__cxx11::string::~string((string *)&local_458);
    peVar5 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar6 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(peVar5->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
    pcVar13 = (char *)std::__cxx11::string::c_str();
    bVar2 = QUtil::same_file(peVar6,pcVar13);
    if (bVar2) break;
    pcVar13 = (char *)std::__cxx11::string::c_str();
    QPDFWriter::QPDFWriter
              ((QPDFWriter *)local_490,
               (QPDF *)&out_afdh.
                        super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,pcVar13);
    w_00 = (QPDFWriter *)local_490;
    setWriterOptions(this,w_00);
    QPDFWriter::write((QPDFWriter *)local_490,(int)w_00,__buf,(size_t)from_afdh);
    local_4b8.outfile = (string *)local_438;
    std::function<void(Pipeline&,std::__cxx11::string_const&)>::
    function<QPDFJob::doSplitPages(QPDF&)::__0,void>
              ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_4b0,&local_4b8);
    doIfVerbose(this,&local_4b0);
    std::
    function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_4b0);
    QPDFWriter::~QPDFWriter((QPDFWriter *)local_490);
    std::__cxx11::string::~string((string *)local_438);
    std::__cxx11::string::~string((string *)local_3d8);
    std::shared_ptr<QPDFAcroFormDocumentHelper>::~shared_ptr
              ((shared_ptr<QPDFAcroFormDocumentHelper> *)local_200);
    QPDF::~QPDF((QPDF *)&out_afdh.
                         super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    peVar5 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    sVar8 = QIntC::to_size<int>(&peVar5->split_pages);
    first = sVar8 + first;
  }
  w.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
       1;
  this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_478,"split pages would overwrite input file with ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438);
  std::runtime_error::runtime_error(this_03,(string *)&local_478);
  w.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
       0;
  __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QPDFJob::doSplitPages(QPDF& pdf)
{
    // Generate output file pattern
    std::string before;
    std::string after;
    size_t len = strlen(m->outfilename.get());
    char* num_spot = strstr(const_cast<char*>(m->outfilename.get()), "%d");
    if (num_spot != nullptr) {
        QTC::TC("qpdf", "QPDFJob split-pages %d");
        before = std::string(m->outfilename.get(), QIntC::to_size(num_spot - m->outfilename.get()));
        after = num_spot + 2;
    } else if (
        (len >= 4) && (QUtil::str_compare_nocase(m->outfilename.get() + len - 4, ".pdf") == 0)) {
        QTC::TC("qpdf", "QPDFJob split-pages .pdf");
        before = std::string(m->outfilename.get(), len - 4) + "-";
        after = m->outfilename.get() + len - 4;
    } else {
        QTC::TC("qpdf", "QPDFJob split-pages other");
        before = std::string(m->outfilename.get()) + "-";
    }

    if (shouldRemoveUnreferencedResources(pdf)) {
        QPDFPageDocumentHelper dh(pdf);
        dh.removeUnreferencedResources();
    }
    QPDFPageLabelDocumentHelper pldh(pdf);
    QPDFAcroFormDocumentHelper afdh(pdf);
    std::vector<QPDFObjectHandle> const& pages = pdf.getAllPages();
    size_t pageno_len = std::to_string(pages.size()).length();
    size_t num_pages = pages.size();
    for (size_t i = 0; i < num_pages; i += QIntC::to_size(m->split_pages)) {
        size_t first = i + 1;
        size_t last = i + QIntC::to_size(m->split_pages);
        if (last > num_pages) {
            last = num_pages;
        }
        QPDF outpdf;
        outpdf.emptyPDF();
        std::shared_ptr<QPDFAcroFormDocumentHelper> out_afdh;
        if (afdh.hasAcroForm()) {
            out_afdh = std::make_shared<QPDFAcroFormDocumentHelper>(outpdf);
        }
        if (m->suppress_warnings) {
            outpdf.setSuppressWarnings(true);
        }
        for (size_t pageno = first; pageno <= last; ++pageno) {
            QPDFObjectHandle page = pages.at(pageno - 1);
            outpdf.addPage(page, false);
            auto new_page = added_page(outpdf, page);
            if (out_afdh.get()) {
                QTC::TC("qpdf", "QPDFJob copy form fields in split_pages");
                try {
                    out_afdh->fixCopiedAnnotations(new_page, page, afdh);
                } catch (std::exception& e) {
                    pdf.warn(
                        qpdf_e_damaged_pdf,
                        "",
                        0,
                        ("Exception caught while fixing copied annotations. This may be a qpdf "
                         "bug." +
                         std::string("Exception: ") + e.what()));
                }
            }
        }
        if (pldh.hasPageLabels()) {
            std::vector<QPDFObjectHandle> labels;
            pldh.getLabelsForPageRange(
                QIntC::to_longlong(first - 1), QIntC::to_longlong(last - 1), 0, labels);
            QPDFObjectHandle page_labels = QPDFObjectHandle::newDictionary();
            page_labels.replaceKey("/Nums", QPDFObjectHandle::newArray(labels));
            outpdf.getRoot().replaceKey("/PageLabels", page_labels);
        }
        std::string page_range = QUtil::uint_to_string(first, QIntC::to_int(pageno_len));
        if (m->split_pages > 1) {
            page_range += "-" + QUtil::uint_to_string(last, QIntC::to_int(pageno_len));
        }
        std::string outfile = before + page_range + after;
        if (QUtil::same_file(m->infilename.get(), outfile.c_str())) {
            throw std::runtime_error("split pages would overwrite input file with " + outfile);
        }
        QPDFWriter w(outpdf, outfile.c_str());
        setWriterOptions(w);
        w.write();
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": wrote file " << outfile << "\n";
        });
    }
}